

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-multiple-listen.c
# Opt level: O0

int run_test_multiple_listen(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  
  start_server();
  client_connect();
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (connection_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x67,"connection_cb_called == 1");
    abort();
  }
  if (connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x68,"connect_cb_called == 1");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x69,"close_cb_called == 2");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x6b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(multiple_listen) {
  start_server();

  client_connect();

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connection_cb_called == 1);
  ASSERT(connect_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}